

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi_custom_type.cpp
# Opt level: O3

void CAPIRegisterCustomType
               (duckdb_connection connection,char *name,duckdb_type duckdb_type,
               duckdb_state expected_outcome)

{
  duckdb_type dVar1;
  undefined8 uVar2;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  duckdb_logical_type base_type;
  duckdb_state status;
  AssertionHandler catchAssertionHandler;
  duckdb_type local_dc;
  undefined8 local_d8;
  duckdb_type local_cc;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  duckdb_type *local_a8;
  char *local_a0;
  size_t sStack_98;
  duckdb_type *local_90;
  AssertionHandler local_88;
  StringRef local_40;
  
  local_dc = duckdb_type;
  uVar2 = duckdb_create_logical_type
                    ((ulong)name & 0xffffffff,name,CONCAT44(in_register_00000014,duckdb_type),
                     CONCAT44(in_register_0000000c,expected_outcome));
  local_d8 = uVar2;
  duckdb_logical_type_set_alias(uVar2,"NUMBER");
  dVar1 = duckdb_register_logical_type(connection,uVar2,0);
  local_b8._vptr_ITransientExpression = (_func_int **)0x4b0ff8;
  local_b8.m_isBinaryExpression = true;
  local_b8.m_result = false;
  local_b8._10_6_ = 0;
  local_c8.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/api/capi/capi_custom_type.cpp"
  ;
  local_c8.line = 0xf;
  local_cc = dVar1;
  Catch::StringRef::StringRef(&local_40,"status == expected_outcome");
  Catch::AssertionHandler::AssertionHandler
            (&local_88,(StringRef *)&local_b8,&local_c8,local_40,Normal);
  Catch::StringRef::StringRef((StringRef *)&local_c8,"==");
  local_b8.m_result = dVar1 == duckdb_type;
  local_b8.m_isBinaryExpression = true;
  local_b8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_005ceea8;
  local_a0 = local_c8.file;
  sStack_98 = local_c8.line;
  local_90 = &local_dc;
  local_a8 = &local_cc;
  Catch::AssertionHandler::handleExpr(&local_88,&local_b8);
  Catch::ITransientExpression::~ITransientExpression(&local_b8);
  Catch::AssertionHandler::complete(&local_88);
  if (local_88.m_completed == false) {
    (*(local_88.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  duckdb_destroy_logical_type(&local_d8);
  duckdb_destroy_logical_type(&local_d8);
  duckdb_destroy_logical_type(0);
  return;
}

Assistant:

static void CAPIRegisterCustomType(duckdb_connection connection, const char *name, duckdb_type duckdb_type,
                                   duckdb_state expected_outcome) {
	duckdb_state status;

	auto base_type = duckdb_create_logical_type(duckdb_type);
	duckdb_logical_type_set_alias(base_type, name);

	status = duckdb_register_logical_type(connection, base_type, nullptr);
	REQUIRE(status == expected_outcome);

	duckdb_destroy_logical_type(&base_type);
	duckdb_destroy_logical_type(&base_type);
	duckdb_destroy_logical_type(nullptr);
}